

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::BaseBuilder::registerLabelNode(BaseBuilder *this,LabelNode *node)

{
  uint uVar1;
  CodeHolder *this_00;
  Error EVar2;
  LabelEntry *in_RAX;
  LabelNode **ppLVar3;
  LabelEntry *le;
  
  this_00 = (this->super_BaseEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar2 = 5;
  }
  else {
    le = in_RAX;
    EVar2 = CodeHolder::newLabelEntry(this_00,&le);
    if (EVar2 == 0) {
      uVar1 = *(uint *)&le->field_0xc;
      if (uVar1 + 1 <= (this->_labelNodes).super_ZoneVectorBase._size) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/builder.cpp"
                   ,0x1cf,"_labelNodes.size() < labelId + 1");
      }
      EVar2 = ZoneVector<asmjit::LabelNode_*>::resize
                        (&this->_labelNodes,&this->_allocator,uVar1 + 1);
      if (EVar2 == 0) {
        ppLVar3 = ZoneVector<asmjit::LabelNode_*>::operator[](&this->_labelNodes,(ulong)uVar1);
        *ppLVar3 = node;
        node->_labelId = uVar1;
        EVar2 = 0;
      }
    }
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::registerLabelNode(LabelNode* node) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  LabelEntry* le;
  ASMJIT_PROPAGATE(_code->newLabelEntry(&le));
  uint32_t labelId = le->id();

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_labelNodes.size() < labelId + 1);
  ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, labelId + 1));

  _labelNodes[labelId] = node;
  node->_labelId = labelId;

  return kErrorOk;
}